

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demoend_playground.cpp
# Opt level: O0

int main(void)

{
  int32_t iVar1;
  ostream *poVar2;
  size_t sVar3;
  size_type sVar4;
  inputs_type local_18c;
  byte local_185;
  inputs_type inputs;
  bool all_ok;
  undefined1 local_178 [8];
  SM sm;
  
  sm.outputs_.pwr_light = none;
  std::operator<<((ostream *)&std::cout,"--- CD player demo playground ---\n");
  estl::state_machine<cdplayer>::state_machine((state_machine<cdplayer> *)local_178);
  poVar2 = std::operator<<((ostream *)&std::cout,"states_count() : ");
  sVar3 = estl::state_machine<cdplayer>::states_count();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"current state  : ");
  iVar1 = estl::state_machine<cdplayer>::state_int((state_machine<cdplayer> *)local_178);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"tv1.size()      : ");
  sVar4 = std::
          vector<estl::state_machine<cdplayer>::test_entry,_std::allocator<estl::state_machine<cdplayer>::test_entry>_>
          ::size(&tv1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar4);
  std::operator<<(poVar2,"\n");
  local_185 = estl::state_machine<cdplayer>::test_transitions
                        ((state_machine<cdplayer> *)local_178,&tv1,true);
  poVar2 = std::operator<<((ostream *)&std::cout,"sm.test_transitions(tv1):");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(local_185 & 1));
  std::operator<<(poVar2,"\n");
  cdplayer::inputs_type::inputs_type(&local_18c);
  estl::state_machine<cdplayer>::state_set((state_machine<cdplayer> *)local_178,on);
  estl::state_machine<cdplayer>::execute_actions((state_machine<cdplayer> *)local_178,&local_18c);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  sm.outputs_.pwr_light = none;
  estl::state_machine<cdplayer>::~state_machine((state_machine<cdplayer> *)local_178);
  return sm.outputs_.pwr_light;
}

Assistant:

int main()
{
    cout << "--- CD player demo playground ---\n";
    SM sm;
    cout << "states_count() : " << sm.states_count() << "\n";
    cout << "current state  : " << sm.state_int() << "\n";
    cout << "tv1.size()      : " << tv1.size() << "\n";
    const auto all_ok = sm.test_transitions(tv1, true);
    cout << "sm.test_transitions(tv1):" << all_ok << "\n";


    SM::inputs_type inputs;
    sm.state_set(state_type::on);
    sm.execute_actions(inputs);


//    cout << sm.outputs().debug_str() << endl;

    cout << endl;
    return 0;
}